

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall
kratos::RemovePassThroughVisitor::visit(RemovePassThroughVisitor *this,Generator *generator)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_00;
  element_type *peVar1;
  Var *var;
  pointer psVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Var *new_var;
  _Rb_tree_node_base *p_Var5;
  InternalException *this_01;
  shared_ptr<kratos::Generator> *child;
  pointer __args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  undefined8 uVar6;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  local_d8;
  undefined4 local_c0 [6];
  undefined1 auStack_a8 [8];
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  child_to_remove;
  undefined1 local_78 [8];
  string var_name;
  undefined1 local_50 [8];
  shared_ptr<kratos::Port> port;
  allocator_type local_31;
  
  port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)generator;
  Generator::get_child_generators(&local_d8,generator);
  auStack_a8 = (undefined1  [8])0x0;
  child_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  child_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__args = local_d8.
                super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = child_to_remove.
               super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               ._M_impl.super__Vector_impl_data._M_start, uVar6 = auStack_a8,
      __args != local_d8.
                super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
    bVar3 = is_pass_through(this,(__args->
                                 super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr);
    if (bVar3) {
      std::
      vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>
      ::emplace_back<std::shared_ptr<kratos::Generator>const&>
                ((vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>
                  *)auStack_a8,__args);
      peVar1 = (__args->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1->is_cloned_ == false) {
        local_78 = (undefined1  [8])peVar1;
        std::
        _Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::_M_emplace<kratos::Generator*>
                  ((_Hashtable<kratos::Generator*,kratos::Generator*,std::allocator<kratos::Generator*>,std::__detail::_Identity,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&this->pass_through_,local_78);
      }
    }
  }
  while( true ) {
    if ((pointer)uVar6 == psVar2) {
      std::
      vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                 *)auStack_a8);
      std::
      vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ::~vector(&local_d8);
      return;
    }
    peVar1 = (((pointer)uVar6)->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (peVar1->is_cloned_ == true) break;
    p_Var5 = (peVar1->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    var_name.field_2._8_8_ = uVar6;
    while( true ) {
      if ((_Rb_tree_header *)p_Var5 == &(peVar1->ports_)._M_t._M_impl.super__Rb_tree_header) break;
      Generator::get_port((Generator *)local_50,
                          (string *)
                          (((pointer)uVar6)->
                          super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
      ;
      if (*(int *)&(((Var *)((long)local_50 + 0x270))->super_IRNode)._vptr_IRNode == 0) {
        iVar4 = (*((IRNode *)local_50)->_vptr_IRNode[0xe])();
        this_02 = port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        var = *(Var **)(*(long *)(*(long *)(CONCAT44(extraout_var,iVar4) + 0x10) + 8) + 0xc0);
        Generator::get_unique_variable_name
                  ((string *)local_78,
                   (Generator *)
                   port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi,&((((pointer)uVar6)->
                           super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                          )->instance_name,(string *)((long)local_50 + 0x78));
        new_var = Generator::var((Generator *)this_02._M_pi,(string *)local_78,
                                 *(uint32_t *)((long)local_50 + 0x98),
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 ((long)local_50 + 0xa0),*(bool *)((long)local_50 + 0xf0));
        if ((char)this_02._M_pi[0xb]._M_weak_count == '\x01') {
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::
          vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)local_c0,
                     *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       **)(*(long *)var_name.field_2._8_8_ + 8),
                     *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       **)(*(long *)var_name.field_2._8_8_ + 0x10),&local_31);
          this_00 = &(new_var->super_IRNode).fn_name_ln;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::_M_move_assign(this_00,(vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                                    *)local_c0);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)local_c0);
          local_c0[0] = 0x137;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<char_const(&)[81],int>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)this_00,
                     (char (*) [81])
                     "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                     ,(int *)local_c0);
          this_02 = port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        }
        Var::move_src_to((Var *)local_50,new_var,(Generator *)this_02._M_pi,false);
        Var::move_sink_to(var,new_var,(Generator *)this_02._M_pi,false);
        std::__cxx11::string::~string((string *)local_78);
        uVar6 = var_name.field_2._8_8_;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    }
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_78,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &((((pointer)uVar6)->
                 super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_enable_shared_from_this<kratos::Generator>);
    Generator::remove_child_generator
              ((Generator *)
               port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
               (shared_ptr<kratos::Generator> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_name);
    uVar6 = (pointer)(uVar6 + 0x10);
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"Unable to optimize passthrough on cloned generator",
             (allocator<char> *)local_c0);
  InternalException::InternalException(this_01,(string *)local_78);
  __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void visit(Generator* generator) override {
        const auto& children = generator->get_child_generators();
        std::vector<std::shared_ptr<Generator>> child_to_remove;
        for (auto const& child : children) {
            if (is_pass_through(child.get())) {
                // need to remove it
                child_to_remove.emplace_back(child);
                // add it to the set
                if (!child->is_cloned()) pass_through_.emplace(child.get());
            }
        }

        for (auto const& child : child_to_remove) {
            if (child->is_cloned())
                throw InternalException("Unable to optimize passthrough on cloned generator");
            // we move the src and sinks around
            const auto& port_names = child->get_port_names();
            for (auto const& port_name : port_names) {
                auto port = child->get_port(port_name);
                if (port->port_direction() == PortDirection::In) {
                    // move the src to whatever it's connected to
                    // basically compress the module into a variable
                    // we will let the later downstream passes to remove the extra wiring
                    auto* next_port = (*(port->sinks().begin()))->left();
                    auto var_name =
                        generator->get_unique_variable_name(child->instance_name, port->name);
                    auto& new_var = generator->var(var_name, port->var_width(), port->size(),
                                                   port->is_signed());
                    if (generator->debug) {
                        // need to copy the changes over
                        new_var.fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                            child->fn_name_ln.begin(), child->fn_name_ln.end());
                        new_var.fn_name_ln.emplace_back(__FILE__, __LINE__);
                    }
                    Var::move_src_to(port.get(), &new_var, generator, false);
                    // move the sinks over
                    Var::move_sink_to(next_port, &new_var, generator, false);
                }
            }
            // remove it from the generator children
            generator->remove_child_generator(child->shared_from_this());
        }
    }